

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3UpsertDelete(sqlite3 *db,Upsert *p)

{
  if (p != (Upsert *)0x0) {
    if (p->pUpsertTarget != (ExprList *)0x0) {
      exprListDeleteNN(db,p->pUpsertTarget);
    }
    if (p->pUpsertTargetWhere != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,p->pUpsertTargetWhere);
    }
    if (p->pUpsertSet != (ExprList *)0x0) {
      exprListDeleteNN(db,p->pUpsertSet);
    }
    if (p->pUpsertWhere != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,p->pUpsertWhere);
    }
    sqlite3DbFreeNN(db,p);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDelete(sqlite3 *db, Upsert *p){
  if( p ){
    sqlite3ExprListDelete(db, p->pUpsertTarget);
    sqlite3ExprDelete(db, p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db, p->pUpsertSet);
    sqlite3ExprDelete(db, p->pUpsertWhere);
    sqlite3DbFree(db, p);
  }
}